

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall asl::File::hasExtension(File *this,String *extensions)

{
  bool bVar1;
  int iVar2;
  String *s;
  int local_9c;
  int i;
  undefined1 local_80 [8];
  String ext;
  String local_58;
  String local_40;
  undefined1 local_28 [8];
  Array<asl::String> exts;
  String *extensions_local;
  File *this_local;
  
  exts._a = extensions;
  asl::String::toLowerCase(&local_40,extensions);
  asl::String::String(&local_58,'|');
  asl::String::split((String *)local_28,&local_40);
  asl::String::~String(&local_58);
  asl::String::~String(&local_40);
  extension((String *)&stack0xffffffffffffff68,this);
  asl::String::toLowerCase((String *)local_80,(String *)&stack0xffffffffffffff68);
  asl::String::~String((String *)&stack0xffffffffffffff68);
  local_9c = 0;
  do {
    iVar2 = Array<asl::String>::length((Array<asl::String> *)local_28);
    if (iVar2 <= local_9c) {
      this_local._7_1_ = false;
LAB_001608f4:
      asl::String::~String((String *)local_80);
      Array<asl::String>::~Array((Array<asl::String> *)local_28);
      return this_local._7_1_;
    }
    s = Array<asl::String>::operator[]((Array<asl::String> *)local_28,local_9c);
    bVar1 = asl::String::operator==((String *)local_80,s);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_001608f4;
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool File::hasExtension(const String& extensions) const
{
	Array<String> exts = extensions.toLowerCase().split('|');
	String ext = extension().toLowerCase();
	for (int i = 0; i < exts.length(); i++)
		if (ext == exts[i])
			return true;
	return false;
}